

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Led.cpp
# Opt level: O2

void __thiscall tiles::Led::cloneTo(Led *this,Chunk *chunk,uint tileIndex,Tile target)

{
  Chunk *ctx;
  Tile *this_00;
  
  this_00 = &target;
  ctx = Tile::getChunk(this_00);
  Tile::getIndex(this_00);
  init((Led *)this_00,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

void Led::cloneTo(const Chunk& chunk, unsigned int tileIndex, Tile target) {
    const auto& tileData = getTileData(chunk, tileIndex);
    init(target.getChunk(), target.getIndex(), tileData.state1);
}